

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_set_irreg_distr(Integer g_a,Integer *mapc,Integer *nblock)

{
  long lVar1;
  C_Integer *pCVar2;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  Integer ga_handle;
  Integer maplen;
  Integer ichk;
  Integer j;
  Integer i;
  Integer in_stack_00000158;
  char *in_stack_00000160;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  
  lVar1 = in_RDI + 1000;
  if (GA[lVar1].actv == 1) {
    pnga_error(in_stack_00000160,in_stack_00000158);
  }
  if (GA[lVar1].ndim < 1) {
    pnga_error(in_stack_00000160,in_stack_00000158);
  }
  for (local_20 = 0; local_20 < GA[lVar1].ndim; local_20 = local_20 + 1) {
    if (GA[lVar1].dims[local_20] < *(long *)(in_RDX + local_20 * 8)) {
      pnga_error(in_stack_00000160,in_stack_00000158);
    }
  }
  local_38 = 0;
  for (local_20 = 0; local_20 < GA[lVar1].ndim; local_20 = local_20 + 1) {
    local_30 = *(long *)(in_RSI + local_38 * 8);
    if ((local_30 < 1) || (GA[lVar1].dims[local_20] + 1 < local_30)) {
      pnga_error(in_stack_00000160,in_stack_00000158);
    }
    for (local_28 = 1; local_38 = local_38 + 1, local_28 < *(long *)(in_RDX + local_20 * 8);
        local_28 = local_28 + 1) {
      if (*(long *)(in_RSI + local_38 * 8) < local_30) {
        pnga_error(in_stack_00000160,in_stack_00000158);
      }
      local_30 = *(long *)(in_RSI + local_38 * 8);
      if ((local_30 < 1) || (GA[lVar1].dims[local_20] + 1 < local_30)) {
        pnga_error(in_stack_00000160,in_stack_00000158);
      }
    }
  }
  local_38 = 0;
  for (local_20 = 0; local_20 < GA[lVar1].ndim; local_20 = local_20 + 1) {
    local_38 = *(long *)(in_RDX + local_20 * 8) + local_38;
    GA[lVar1].nblock[local_20] = (int)*(undefined8 *)(in_RDX + local_20 * 8);
  }
  pCVar2 = (C_Integer *)malloc((local_38 + 1) * 8);
  GA[lVar1].mapc = pCVar2;
  for (local_20 = 0; local_20 < local_38; local_20 = local_20 + 1) {
    GA[lVar1].mapc[local_20] = *(C_Integer *)(in_RSI + local_20 * 8);
  }
  GA[lVar1].mapc[local_38] = -1;
  GA[lVar1].irreg = 1;
  return;
}

Assistant:

void pnga_set_irreg_distr(Integer g_a, Integer *mapc, Integer *nblock)
{
  Integer i, j, ichk, maplen;
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].actv == 1)
    pnga_error("Cannot set irregular data distribution on array that has been allocated",0);
  if (GA[ga_handle].ndim < 1)
    pnga_error("Dimensions must be set before irregular distribution is specified",0);
  for (i=0; i<GA[ga_handle].ndim; i++)
    if ((C_Integer)nblock[i] > GA[ga_handle].dims[i])
      pnga_error("number of blocks must be <= corresponding dimension",i);
  /* Check to see that mapc array is sensible */
  maplen = 0;
  for (i=0; i<GA[ga_handle].ndim; i++) {
    ichk = mapc[maplen];
    if (ichk < 1 || ichk > GA[ga_handle].dims[i]+1)
      pnga_error("Mapc entry outside array dimension limits",ichk);
    maplen++;
    for (j=1; j<nblock[i]; j++) {
      if (mapc[maplen] < ichk) {
        pnga_error("Mapc entries are not properly monotonic",ichk);
      }
      ichk = mapc[maplen];
      if (ichk < 1 || ichk > GA[ga_handle].dims[i]+1)
        pnga_error("Mapc entry outside array dimension limits",ichk);
      maplen++;
    }
  }

  maplen = 0;
  for (i=0; i<GA[ga_handle].ndim; i++) {
    maplen += nblock[i];
    GA[ga_handle].nblock[i] = (C_Integer)nblock[i];
  }
  GA[ga_handle].mapc = (C_Integer*)malloc((maplen+1)*sizeof(C_Integer*));
  for (i=0; i<maplen; i++) {
    GA[ga_handle].mapc[i] = (C_Integer)mapc[i];
  }
  GA[ga_handle].mapc[maplen] = -1;
  GA[ga_handle].irreg = 1;
}